

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  long lVar3;
  undefined8 uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  ulong uVar13;
  __m128i *palVar14;
  undefined1 auVar15 [16];
  ulong uVar16;
  int iVar17;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar18;
  __m128i *b_00;
  ulong uVar19;
  int iVar20;
  undefined4 in_register_0000000c;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  long lVar21;
  __m128i *ptr;
  ulong size;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  __m128i *palVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  bool bVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar40;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  short sVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ushort uVar45;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  undefined1 auVar56 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  short sVar67;
  short sVar68;
  short sVar69;
  undefined1 auVar66 [16];
  uint uVar71;
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i c;
  __m128i c_00;
  uint local_11c;
  __m128i *local_110;
  int local_f0;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar23 = profile->s1Len;
        if ((int)uVar23 < 1) {
          parasail_sw_table_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_striped_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_striped_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_striped_profile_sse2_128_16_cold_1();
        }
        else {
          uVar19 = (ulong)uVar23 + 7;
          iVar17 = ppVar6->max;
          uVar30 = (uint)uVar19 & 0x7ffffff8;
          iVar20 = open;
          result = parasail_result_new_table1(uVar30,s2Len);
          if (result != (parasail_result_t *)0x0) {
            size = uVar19 >> 3;
            result->flag = result->flag | 0x8220804;
            b = parasail_memalign___m128i(0x10,size);
            palVar18 = parasail_memalign___m128i(0x10,size);
            local_110 = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            auVar34._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
            auVar34._4_4_ = -(uint)((int)palVar18 == 0 && (int)((ulong)palVar18 >> 0x20) == 0);
            auVar34._8_4_ = -(uint)((int)((ulong)local_110 >> 0x20) == 0 && (int)local_110 == 0);
            auVar34._12_4_ = -(uint)((int)b_00 == 0 && (int)((ulong)b_00 >> 0x20) == 0);
            iVar20 = movmskps(iVar20,auVar34);
            len = CONCAT44(in_register_0000000c,iVar20);
            if (iVar20 == 0) {
              auVar34 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar32 = auVar34._0_4_;
              auVar34 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar33 = auVar34._0_4_;
              c[1] = extraout_RDX;
              c[0] = size;
              parasail_memset___m128i(b,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = size;
              parasail_memset___m128i(b_00,c_00,len);
              auVar34 = _DAT_00905040;
              auVar72._4_4_ = uVar33;
              auVar72._0_4_ = uVar33;
              auVar72._8_4_ = uVar33;
              auVar72._12_4_ = uVar33;
              auVar15._4_4_ = uVar32;
              auVar15._0_4_ = uVar32;
              auVar15._8_4_ = uVar32;
              auVar15._12_4_ = uVar32;
              uVar24 = 0;
              uVar16 = (ulong)(uint)s2Len;
              lVar27 = size * uVar16;
              lVar3 = lVar27 * 4;
              local_11c = (uint)CONCAT62((int6)((ulong)lVar3 >> 0x10),0x8000);
              lVar29 = 0;
              uVar26 = 0;
              auVar65 = _DAT_00905040;
              auVar38 = _DAT_00905040;
              do {
                ptr = b;
                iVar20 = ppVar6->mapper[(byte)s2[uVar26]];
                local_f0 = (int)uVar26;
                iVar22 = (int)uVar24;
                palVar25 = local_110;
                b = palVar18;
                if (iVar22 == local_f0 + -2) {
                  palVar25 = palVar18;
                  b = local_110;
                }
                uVar13 = ptr[(int)size - 1][0];
                auVar64._0_8_ = uVar13 << 0x10;
                auVar64._8_8_ = ptr[(int)size - 1][1] << 0x10 | uVar13 >> 0x30;
                auVar64 = auVar64 | ZEXT416(0x8000);
                lVar28 = 0;
                lVar21 = lVar29;
                auVar47 = auVar65;
                auVar42 = auVar34;
                do {
                  auVar65 = paddsw(auVar64,*(undefined1 (*) [16])
                                            ((long)pvVar5 + lVar28 + size * (long)iVar20 * 0x10));
                  auVar64 = *(undefined1 (*) [16])((long)*b_00 + lVar28);
                  sVar67 = auVar42._0_2_;
                  sVar68 = auVar64._0_2_;
                  uVar45 = (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68;
                  sVar67 = auVar42._2_2_;
                  sVar68 = auVar64._2_2_;
                  uVar49 = (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68;
                  sVar67 = auVar42._4_2_;
                  sVar68 = auVar64._4_2_;
                  uVar50 = (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68;
                  sVar67 = auVar42._6_2_;
                  sVar68 = auVar64._6_2_;
                  uVar51 = (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68;
                  sVar67 = auVar42._8_2_;
                  sVar68 = auVar64._8_2_;
                  uVar52 = (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68;
                  sVar67 = auVar42._10_2_;
                  sVar68 = auVar64._10_2_;
                  uVar53 = (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68;
                  sVar67 = auVar42._12_2_;
                  sVar68 = auVar64._12_2_;
                  sVar69 = auVar64._14_2_;
                  uVar54 = (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68;
                  sVar67 = auVar42._14_2_;
                  uVar55 = (ushort)(sVar69 < sVar67) * sVar67 | (ushort)(sVar69 >= sVar67) * sVar69;
                  sVar67 = auVar65._0_2_;
                  auVar46._0_2_ =
                       (ushort)((short)uVar45 < sVar67) * sVar67 |
                       ((short)uVar45 >= sVar67) * uVar45;
                  sVar67 = auVar65._2_2_;
                  auVar46._2_2_ =
                       (ushort)((short)uVar49 < sVar67) * sVar67 |
                       ((short)uVar49 >= sVar67) * uVar49;
                  sVar67 = auVar65._4_2_;
                  auVar46._4_2_ =
                       (ushort)((short)uVar50 < sVar67) * sVar67 |
                       ((short)uVar50 >= sVar67) * uVar50;
                  sVar67 = auVar65._6_2_;
                  auVar46._6_2_ =
                       (ushort)((short)uVar51 < sVar67) * sVar67 |
                       ((short)uVar51 >= sVar67) * uVar51;
                  sVar67 = auVar65._8_2_;
                  auVar46._8_2_ =
                       (ushort)((short)uVar52 < sVar67) * sVar67 |
                       ((short)uVar52 >= sVar67) * uVar52;
                  sVar67 = auVar65._10_2_;
                  auVar46._10_2_ =
                       (ushort)((short)uVar53 < sVar67) * sVar67 |
                       ((short)uVar53 >= sVar67) * uVar53;
                  sVar67 = auVar65._12_2_;
                  auVar46._12_2_ =
                       (ushort)((short)uVar54 < sVar67) * sVar67 |
                       ((short)uVar54 >= sVar67) * uVar54;
                  sVar67 = auVar65._14_2_;
                  auVar46._14_2_ =
                       (ushort)((short)uVar55 < sVar67) * sVar67 |
                       ((short)uVar55 >= sVar67) * uVar55;
                  *(undefined1 (*) [16])((long)*b + lVar28) = auVar46;
                  piVar7 = ((result->field_4).rowcols)->score_row;
                  *(int *)((long)piVar7 + lVar21) = (short)auVar46._0_2_ + 0x8000;
                  *(int *)((long)piVar7 + lVar3 + lVar21) = (short)auVar46._2_2_ + 0x8000;
                  *(int *)((long)piVar7 + lVar27 * 8 + lVar21) = (short)auVar46._4_2_ + 0x8000;
                  *(int *)((long)piVar7 + lVar27 * 0xc + lVar21) = (short)auVar46._6_2_ + 0x8000;
                  *(int *)((long)piVar7 + lVar27 * 0x10 + lVar21) = (short)auVar46._8_2_ + 0x8000;
                  *(int *)((long)piVar7 + lVar27 * 0x14 + lVar21) = (short)auVar46._10_2_ + 0x8000;
                  *(int *)((long)piVar7 + lVar27 * 0x18 + lVar21) = (short)auVar46._12_2_ + 0x8000;
                  *(int *)((long)piVar7 + lVar27 * 0x1c + lVar21) = (short)auVar46._14_2_ + 0x8000;
                  sVar67 = auVar47._0_2_;
                  auVar65._0_2_ =
                       (sVar67 < (short)auVar46._0_2_) * auVar46._0_2_ |
                       (ushort)(sVar67 >= (short)auVar46._0_2_) * sVar67;
                  sVar67 = auVar47._2_2_;
                  auVar65._2_2_ =
                       (sVar67 < (short)auVar46._2_2_) * auVar46._2_2_ |
                       (ushort)(sVar67 >= (short)auVar46._2_2_) * sVar67;
                  sVar67 = auVar47._4_2_;
                  auVar65._4_2_ =
                       (sVar67 < (short)auVar46._4_2_) * auVar46._4_2_ |
                       (ushort)(sVar67 >= (short)auVar46._4_2_) * sVar67;
                  sVar67 = auVar47._6_2_;
                  auVar65._6_2_ =
                       (sVar67 < (short)auVar46._6_2_) * auVar46._6_2_ |
                       (ushort)(sVar67 >= (short)auVar46._6_2_) * sVar67;
                  sVar67 = auVar47._8_2_;
                  auVar65._8_2_ =
                       (sVar67 < (short)auVar46._8_2_) * auVar46._8_2_ |
                       (ushort)(sVar67 >= (short)auVar46._8_2_) * sVar67;
                  sVar67 = auVar47._10_2_;
                  auVar65._10_2_ =
                       (sVar67 < (short)auVar46._10_2_) * auVar46._10_2_ |
                       (ushort)(sVar67 >= (short)auVar46._10_2_) * sVar67;
                  sVar67 = auVar47._12_2_;
                  sVar68 = auVar47._14_2_;
                  auVar65._12_2_ =
                       (sVar67 < (short)auVar46._12_2_) * auVar46._12_2_ |
                       (ushort)(sVar67 >= (short)auVar46._12_2_) * sVar67;
                  auVar65._14_2_ =
                       (sVar68 < (short)auVar46._14_2_) * auVar46._14_2_ |
                       (ushort)(sVar68 >= (short)auVar46._14_2_) * sVar68;
                  auVar47 = psubsw(auVar46,auVar15);
                  auVar64 = psubsw(auVar64,auVar72);
                  sVar67 = auVar47._0_2_;
                  sVar41 = auVar64._0_2_;
                  sVar68 = auVar47._2_2_;
                  sVar57 = auVar64._2_2_;
                  sVar69 = auVar47._4_2_;
                  sVar58 = auVar64._4_2_;
                  sVar8 = auVar47._6_2_;
                  sVar59 = auVar64._6_2_;
                  sVar9 = auVar47._8_2_;
                  sVar60 = auVar64._8_2_;
                  sVar10 = auVar47._10_2_;
                  sVar61 = auVar64._10_2_;
                  sVar11 = auVar47._12_2_;
                  sVar62 = auVar64._12_2_;
                  sVar63 = auVar64._14_2_;
                  sVar12 = auVar47._14_2_;
                  puVar1 = (ushort *)((long)*b_00 + lVar28);
                  *puVar1 = (ushort)(sVar41 < sVar67) * sVar67 | (ushort)(sVar41 >= sVar67) * sVar41
                  ;
                  puVar1[1] = (ushort)(sVar57 < sVar68) * sVar68 |
                              (ushort)(sVar57 >= sVar68) * sVar57;
                  puVar1[2] = (ushort)(sVar58 < sVar69) * sVar69 |
                              (ushort)(sVar58 >= sVar69) * sVar58;
                  puVar1[3] = (ushort)(sVar59 < sVar8) * sVar8 | (ushort)(sVar59 >= sVar8) * sVar59;
                  puVar1[4] = (ushort)(sVar60 < sVar9) * sVar9 | (ushort)(sVar60 >= sVar9) * sVar60;
                  puVar1[5] = (ushort)(sVar61 < sVar10) * sVar10 |
                              (ushort)(sVar61 >= sVar10) * sVar61;
                  puVar1[6] = (ushort)(sVar62 < sVar11) * sVar11 |
                              (ushort)(sVar62 >= sVar11) * sVar62;
                  puVar1[7] = (ushort)(sVar63 < sVar12) * sVar12 |
                              (ushort)(sVar63 >= sVar12) * sVar63;
                  auVar64 = psubsw(auVar42,auVar72);
                  sVar41 = auVar64._0_2_;
                  auVar42._0_2_ =
                       (ushort)(sVar41 < sVar67) * sVar67 | (ushort)(sVar41 >= sVar67) * sVar41;
                  sVar67 = auVar64._2_2_;
                  auVar42._2_2_ =
                       (ushort)(sVar67 < sVar68) * sVar68 | (ushort)(sVar67 >= sVar68) * sVar67;
                  sVar67 = auVar64._4_2_;
                  auVar42._4_2_ =
                       (ushort)(sVar67 < sVar69) * sVar69 | (ushort)(sVar67 >= sVar69) * sVar67;
                  sVar67 = auVar64._6_2_;
                  auVar42._6_2_ =
                       (ushort)(sVar67 < sVar8) * sVar8 | (ushort)(sVar67 >= sVar8) * sVar67;
                  sVar67 = auVar64._8_2_;
                  auVar42._8_2_ =
                       (ushort)(sVar67 < sVar9) * sVar9 | (ushort)(sVar67 >= sVar9) * sVar67;
                  sVar67 = auVar64._10_2_;
                  auVar42._10_2_ =
                       (ushort)(sVar67 < sVar10) * sVar10 | (ushort)(sVar67 >= sVar10) * sVar67;
                  sVar67 = auVar64._12_2_;
                  sVar68 = auVar64._14_2_;
                  auVar42._12_2_ =
                       (ushort)(sVar67 < sVar11) * sVar11 | (ushort)(sVar67 >= sVar11) * sVar67;
                  auVar42._14_2_ =
                       (ushort)(sVar68 < sVar12) * sVar12 | (ushort)(sVar68 >= sVar12) * sVar68;
                  auVar64 = *(undefined1 (*) [16])((long)*ptr + lVar28);
                  lVar28 = lVar28 + 0x10;
                  lVar21 = lVar21 + uVar16 * 4;
                  auVar47 = auVar65;
                } while (size << 4 != lVar28);
                iVar20 = 0;
                do {
                  auVar47._0_8_ = auVar42._0_8_ << 0x10;
                  auVar47._8_8_ = auVar42._8_8_ << 0x10 | auVar42._0_8_ >> 0x30;
                  auVar42 = auVar47 | ZEXT416(0x8000);
                  lVar28 = 0;
                  lVar21 = lVar29;
                  auVar64 = auVar65;
                  do {
                    psVar2 = (short *)((long)*b + lVar28);
                    sVar68 = *psVar2;
                    sVar69 = psVar2[1];
                    sVar8 = psVar2[2];
                    sVar9 = psVar2[3];
                    sVar10 = psVar2[4];
                    sVar11 = psVar2[5];
                    sVar12 = psVar2[6];
                    sVar41 = psVar2[7];
                    sVar67 = auVar42._0_2_;
                    auVar48._0_2_ =
                         (ushort)(sVar68 < sVar67) * sVar67 | (ushort)(sVar68 >= sVar67) * sVar68;
                    sVar67 = auVar42._2_2_;
                    auVar48._2_2_ =
                         (ushort)(sVar69 < sVar67) * sVar67 | (ushort)(sVar69 >= sVar67) * sVar69;
                    sVar67 = auVar42._4_2_;
                    auVar48._4_2_ =
                         (ushort)(sVar8 < sVar67) * sVar67 | (ushort)(sVar8 >= sVar67) * sVar8;
                    sVar67 = auVar42._6_2_;
                    auVar48._6_2_ =
                         (ushort)(sVar9 < sVar67) * sVar67 | (ushort)(sVar9 >= sVar67) * sVar9;
                    sVar67 = auVar42._8_2_;
                    auVar48._8_2_ =
                         (ushort)(sVar10 < sVar67) * sVar67 | (ushort)(sVar10 >= sVar67) * sVar10;
                    sVar67 = auVar42._10_2_;
                    auVar48._10_2_ =
                         (ushort)(sVar11 < sVar67) * sVar67 | (ushort)(sVar11 >= sVar67) * sVar11;
                    sVar67 = auVar42._12_2_;
                    auVar48._12_2_ =
                         (ushort)(sVar12 < sVar67) * sVar67 | (ushort)(sVar12 >= sVar67) * sVar12;
                    sVar67 = auVar42._14_2_;
                    auVar48._14_2_ =
                         (ushort)(sVar41 < sVar67) * sVar67 | (ushort)(sVar41 >= sVar67) * sVar41;
                    *(undefined1 (*) [16])((long)*b + lVar28) = auVar48;
                    piVar7 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar7 + lVar21) = (short)auVar48._0_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar3 + lVar21) = (short)auVar48._2_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar27 * 8 + lVar21) = (short)auVar48._4_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar27 * 0xc + lVar21) = (short)auVar48._6_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar27 * 0x10 + lVar21) = (short)auVar48._8_2_ + 0x8000;
                    *(int *)((long)piVar7 + lVar27 * 0x14 + lVar21) = (short)auVar48._10_2_ + 0x8000
                    ;
                    *(int *)((long)piVar7 + lVar27 * 0x18 + lVar21) = (short)auVar48._12_2_ + 0x8000
                    ;
                    *(int *)((long)piVar7 + lVar27 * 0x1c + lVar21) = (short)auVar48._14_2_ + 0x8000
                    ;
                    sVar67 = auVar64._0_2_;
                    auVar65._0_2_ =
                         (sVar67 < (short)auVar48._0_2_) * auVar48._0_2_ |
                         (ushort)(sVar67 >= (short)auVar48._0_2_) * sVar67;
                    sVar67 = auVar64._2_2_;
                    auVar65._2_2_ =
                         (sVar67 < (short)auVar48._2_2_) * auVar48._2_2_ |
                         (ushort)(sVar67 >= (short)auVar48._2_2_) * sVar67;
                    sVar67 = auVar64._4_2_;
                    auVar65._4_2_ =
                         (sVar67 < (short)auVar48._4_2_) * auVar48._4_2_ |
                         (ushort)(sVar67 >= (short)auVar48._4_2_) * sVar67;
                    sVar67 = auVar64._6_2_;
                    auVar65._6_2_ =
                         (sVar67 < (short)auVar48._6_2_) * auVar48._6_2_ |
                         (ushort)(sVar67 >= (short)auVar48._6_2_) * sVar67;
                    sVar67 = auVar64._8_2_;
                    auVar65._8_2_ =
                         (sVar67 < (short)auVar48._8_2_) * auVar48._8_2_ |
                         (ushort)(sVar67 >= (short)auVar48._8_2_) * sVar67;
                    sVar67 = auVar64._10_2_;
                    auVar65._10_2_ =
                         (sVar67 < (short)auVar48._10_2_) * auVar48._10_2_ |
                         (ushort)(sVar67 >= (short)auVar48._10_2_) * sVar67;
                    sVar67 = auVar64._12_2_;
                    sVar68 = auVar64._14_2_;
                    auVar65._12_2_ =
                         (sVar67 < (short)auVar48._12_2_) * auVar48._12_2_ |
                         (ushort)(sVar67 >= (short)auVar48._12_2_) * sVar67;
                    auVar65._14_2_ =
                         (sVar68 < (short)auVar48._14_2_) * auVar48._14_2_ |
                         (ushort)(sVar68 >= (short)auVar48._14_2_) * sVar68;
                    auVar64 = psubsw(auVar48,auVar15);
                    auVar42 = psubsw(auVar42,auVar72);
                    auVar56._0_2_ = -(ushort)(auVar64._0_2_ < auVar42._0_2_);
                    auVar56._2_2_ = -(ushort)(auVar64._2_2_ < auVar42._2_2_);
                    auVar56._4_2_ = -(ushort)(auVar64._4_2_ < auVar42._4_2_);
                    auVar56._6_2_ = -(ushort)(auVar64._6_2_ < auVar42._6_2_);
                    auVar56._8_2_ = -(ushort)(auVar64._8_2_ < auVar42._8_2_);
                    auVar56._10_2_ = -(ushort)(auVar64._10_2_ < auVar42._10_2_);
                    auVar56._12_2_ = -(ushort)(auVar64._12_2_ < auVar42._12_2_);
                    auVar56._14_2_ = -(ushort)(auVar64._14_2_ < auVar42._14_2_);
                    if ((((((((((((((((auVar56 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar56 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar56 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar56 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar56 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar56 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar56 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar56 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar56 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar56 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar56 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar56 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar56 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar56 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar56._14_2_ >> 7 & 1) == 0) && (auVar56._14_2_ & 0x8000) == 0)
                    goto LAB_005c5a76;
                    lVar28 = lVar28 + 0x10;
                    lVar21 = lVar21 + uVar16 * 4;
                    auVar64 = auVar65;
                  } while (size << 4 != lVar28);
                  iVar20 = iVar20 + 1;
                } while (iVar20 != 8);
LAB_005c5a76:
                auVar43._0_2_ = -(ushort)(auVar38._0_2_ < (short)auVar65._0_2_);
                auVar43._2_2_ = -(ushort)(auVar38._2_2_ < (short)auVar65._2_2_);
                auVar43._4_2_ = -(ushort)(auVar38._4_2_ < (short)auVar65._4_2_);
                auVar43._6_2_ = -(ushort)(auVar38._6_2_ < (short)auVar65._6_2_);
                auVar43._8_2_ = -(ushort)(auVar38._8_2_ < (short)auVar65._8_2_);
                auVar43._10_2_ = -(ushort)(auVar38._10_2_ < (short)auVar65._10_2_);
                auVar43._12_2_ = -(ushort)(auVar38._12_2_ < (short)auVar65._12_2_);
                auVar43._14_2_ = -(ushort)(auVar38._14_2_ < (short)auVar65._14_2_);
                if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar43 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar43 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar43 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar43 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar43 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar43 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar43 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar43 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar43 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar43 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar43._14_2_ >> 7 & 1) != 0) || (auVar43._14_2_ & 0x8000) != 0) {
                  uVar45 = ((short)auVar65._8_2_ < (short)auVar65._0_2_) * auVar65._0_2_ |
                           ((short)auVar65._8_2_ >= (short)auVar65._0_2_) * auVar65._8_2_;
                  uVar49 = ((short)auVar65._10_2_ < (short)auVar65._2_2_) * auVar65._2_2_ |
                           ((short)auVar65._10_2_ >= (short)auVar65._2_2_) * auVar65._10_2_;
                  uVar50 = ((short)auVar65._12_2_ < (short)auVar65._4_2_) * auVar65._4_2_ |
                           ((short)auVar65._12_2_ >= (short)auVar65._4_2_) * auVar65._12_2_;
                  uVar51 = ((short)auVar65._14_2_ < (short)auVar65._6_2_) * auVar65._6_2_ |
                           ((short)auVar65._14_2_ >= (short)auVar65._6_2_) * auVar65._14_2_;
                  sVar67 = (0 < (short)auVar65._8_2_) * auVar65._8_2_;
                  sVar68 = (0 < (short)auVar65._10_2_) * auVar65._10_2_;
                  sVar69 = (0 < (short)auVar65._12_2_) * auVar65._12_2_;
                  sVar8 = (0 < (short)auVar65._14_2_) * auVar65._14_2_;
                  uVar45 = ((short)uVar50 < (short)uVar45) * uVar45 |
                           ((short)uVar50 >= (short)uVar45) * uVar50;
                  uVar49 = ((short)uVar51 < (short)uVar49) * uVar49 |
                           ((short)uVar51 >= (short)uVar49) * uVar51;
                  uVar50 = (sVar67 < (short)uVar50) * uVar50 |
                           (ushort)(sVar67 >= (short)uVar50) * sVar67;
                  uVar51 = (sVar68 < (short)uVar51) * uVar51 |
                           (ushort)(sVar68 >= (short)uVar51) * sVar68;
                  uVar52 = (ushort)(sVar69 < sVar67) * sVar67 | (ushort)(sVar69 >= sVar67) * sVar69;
                  uVar53 = (ushort)(sVar8 < sVar68) * sVar68 | (ushort)(sVar8 >= sVar68) * sVar8;
                  sVar69 = (ushort)(0 < sVar69) * sVar69;
                  sVar8 = (ushort)(0 < sVar8) * sVar8;
                  uVar45 = ((short)uVar49 < (short)uVar45) * uVar45 |
                           ((short)uVar49 >= (short)uVar45) * uVar49;
                  auVar37._0_4_ =
                       CONCAT22(((short)uVar50 < (short)uVar49) * uVar49 |
                                ((short)uVar50 >= (short)uVar49) * uVar50,uVar45);
                  auVar37._4_2_ =
                       ((short)uVar51 < (short)uVar50) * uVar50 |
                       ((short)uVar51 >= (short)uVar50) * uVar51;
                  auVar37._6_2_ =
                       ((short)uVar52 < (short)uVar51) * uVar51 |
                       ((short)uVar52 >= (short)uVar51) * uVar52;
                  auVar37._8_2_ =
                       ((short)uVar53 < (short)uVar52) * uVar52 |
                       ((short)uVar53 >= (short)uVar52) * uVar53;
                  auVar37._10_2_ =
                       (sVar69 < (short)uVar53) * uVar53 |
                       (ushort)(sVar69 >= (short)uVar53) * sVar69;
                  auVar37._12_2_ =
                       (ushort)(sVar8 < sVar69) * sVar69 | (ushort)(sVar8 >= sVar69) * sVar8;
                  auVar37._14_2_ = (ushort)(0 < sVar8) * sVar8;
                  local_11c = auVar37._0_4_;
                  if ((short)(0x7ffe - (short)iVar17) < (short)uVar45) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    break;
                  }
                  auVar38 = pshuflw(auVar37,auVar37,0);
                  auVar38._4_4_ = auVar38._0_4_;
                  auVar38._8_4_ = auVar38._0_4_;
                  auVar38._12_4_ = auVar38._0_4_;
                  uVar24 = uVar26 & 0xffffffff;
                }
                iVar22 = (int)uVar24;
                uVar26 = uVar26 + 1;
                lVar29 = lVar29 + 4;
                palVar18 = ptr;
                local_110 = palVar25;
                local_f0 = s2Len;
              } while (uVar26 != uVar16);
              if ((short)local_11c == 0x7fff) {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
              }
              iVar17 = parasail_result_is_saturated(result);
              palVar18 = palVar25;
              if (iVar17 == 0) {
                palVar14 = ptr;
                if (iVar22 == local_f0 + -2) {
                  palVar18 = ptr;
                  palVar14 = palVar25;
                }
                if (iVar22 == local_f0 + -1) {
                  palVar18 = b;
                  b = palVar25;
                  palVar14 = ptr;
                }
                ptr = palVar14;
                uVar23 = uVar23 - 1;
                bVar31 = (uVar19 & 0x7ffffff8) == 0;
                if (!bVar31) {
                  if (bVar31) {
                    uVar19 = 0;
                    do {
                      uVar30 = (uint)(uVar19 >> 3) & 0x1fffffff;
                      if ((int)uVar23 <= (int)uVar30) {
                        uVar30 = uVar23;
                      }
                      if (*(short *)((long)*palVar18 + uVar19 * 2) == (short)local_11c) {
                        uVar23 = uVar30;
                      }
                      uVar19 = uVar19 + 1;
                    } while ((int)uVar19 != 0);
                  }
                  else {
                    auVar35._4_4_ = uVar23;
                    auVar35._0_4_ = uVar23;
                    auVar35._8_4_ = uVar23;
                    auVar35._12_4_ = uVar23;
                    auVar34 = pshuflw(ZEXT416(local_11c),ZEXT416(local_11c),0);
                    uVar19 = 0;
                    auVar44 = _DAT_00904a60;
                    do {
                      uVar4 = *(undefined8 *)((long)*palVar18 + uVar19 * 2);
                      auVar66._0_2_ = -(ushort)((short)uVar4 == auVar34._0_2_);
                      sVar67 = -(ushort)((short)((ulong)uVar4 >> 0x10) == auVar34._2_2_);
                      sVar68 = -(ushort)((short)((ulong)uVar4 >> 0x20) == auVar34._4_2_);
                      sVar69 = -(ushort)((short)((ulong)uVar4 >> 0x30) == auVar34._6_2_);
                      auVar66._8_8_ =
                           (undefined8)
                           (CONCAT64(CONCAT42(CONCAT22(sVar69,sVar69),sVar68),
                                     CONCAT22(sVar68,sVar69)) >> 0x10);
                      auVar66._6_2_ = sVar67;
                      auVar66._4_2_ = sVar67;
                      auVar66._2_2_ = auVar66._0_2_;
                      uVar23 = auVar44._4_4_;
                      uVar40 = auVar44._8_4_;
                      uVar71 = auVar44._12_4_;
                      auVar72 = auVar44 & _DAT_00904b30;
                      auVar73._0_4_ = (int)(auVar72._0_4_ * size) + (auVar44._0_4_ >> 3);
                      auVar73._4_4_ = (int)(auVar72._4_4_ * size) + (uVar23 >> 3);
                      auVar73._8_4_ = (int)((auVar72._8_8_ & 0xffffffff) * size) + (uVar40 >> 3);
                      auVar73._12_4_ = (int)(auVar72._12_4_ * size) + (uVar71 >> 3);
                      auVar70._0_4_ = -(uint)(auVar73._0_4_ < auVar35._0_4_);
                      auVar70._4_4_ = -(uint)(auVar73._4_4_ < auVar35._4_4_);
                      auVar70._8_4_ = -(uint)(auVar73._8_4_ < auVar35._8_4_);
                      auVar70._12_4_ = -(uint)(auVar73._12_4_ < auVar35._12_4_);
                      auVar35 = ~auVar66 & auVar35 |
                                (~auVar70 & auVar35 | auVar73 & auVar70) & auVar66;
                      uVar19 = uVar19 + 4;
                      auVar44._0_4_ = auVar44._0_4_ + 4;
                      auVar44._4_4_ = uVar23 + 4;
                      auVar44._8_4_ = uVar40 + 4;
                      auVar44._12_4_ = uVar71 + 4;
                    } while (uVar30 != uVar19);
                    auVar36._0_8_ = auVar35._8_8_;
                    auVar36._8_4_ = auVar35._8_4_;
                    auVar36._12_4_ = auVar35._12_4_;
                    auVar39._0_4_ = -(uint)(auVar35._0_4_ < auVar35._8_4_);
                    auVar39._4_4_ = -(uint)(auVar35._4_4_ < auVar35._12_4_);
                    auVar39._8_8_ = 0;
                    auVar34 = ~auVar39 & auVar36 | auVar35 & auVar39;
                    uVar30 = auVar34._0_4_;
                    uVar40 = auVar34._4_4_;
                    uVar23 = -(uint)((int)uVar30 < (int)uVar40);
                    uVar23 = ~uVar23 & uVar40 | uVar30 & uVar23;
                  }
                }
                iVar17 = (short)local_11c + 0x8000;
              }
              else {
                iVar22 = 0;
                iVar17 = 0xffff;
                uVar23 = 0;
              }
              result->score = iVar17;
              result->end_query = uVar23;
              result->end_ref = iVar22;
              parasail_free(b_00);
              parasail_free(palVar18);
              parasail_free(ptr);
              parasail_free(b);
              return result;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    __m128i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi16(
            _mm_set_epi16(0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 2);
        vH = _mm_blendv_epi8_rpl(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_blendv_epi8_rpl(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}